

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tsgCoreOneDimensional.cpp
# Opt level: O2

vector<double,_std::allocator<double>_> *
TasGrid::OneDimensionalNodes::getFejer2Nodes
          (vector<double,_std::allocator<double>_> *__return_storage_ptr__,int level)

{
  int iVar1;
  int i;
  int iVar2;
  int iVar3;
  int iVar4;
  long lVar5;
  double dVar6;
  allocator_type local_49;
  ulong local_48;
  double local_40;
  value_type_conflict2 local_38;
  
  local_38 = 0.0;
  ::std::vector<double,_std::allocator<double>_>::vector
            (__return_storage_ptr__,(ulong)(uint)~(-1 << ((char)level + 1U & 0x1f)),&local_38,
             &local_49);
  if (0 < level) {
    local_48 = (ulong)(level + 2);
    lVar5 = 1;
    for (iVar1 = 2; iVar1 != (int)local_48; iVar1 = iVar1 + 1) {
      iVar3 = 1 << ((byte)iVar1 & 0x1f);
      local_40 = (double)iVar3;
      lVar5 = (long)(int)lVar5;
      iVar4 = iVar3 + -1;
      for (iVar2 = 1; iVar2 <= iVar3; iVar2 = iVar2 + 2) {
        dVar6 = cos(((double)iVar4 * 3.141592653589793) / local_40);
        (__return_storage_ptr__->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
        super__Vector_impl_data._M_start[lVar5] = dVar6;
        lVar5 = lVar5 + 1;
        iVar4 = iVar4 + -2;
      }
    }
  }
  return __return_storage_ptr__;
}

Assistant:

std::vector<double> OneDimensionalNodes::getFejer2Nodes(int level){
    int n = OneDimensionalMeta::getNumPoints(level, rule_fejer2);
    std::vector<double> nodes(n, 0.0);
    if (level > 0){
        int count = 1;
        for(int l=2; l<=level+1; l++){
            n = OneDimensionalMeta::getNumPoints(l, rule_clenshawcurtis);
            for(int i=1; i<n; i+=2){
                nodes[count++] = std::cos(Maths::pi * ((double) (n-i-1)) / ((double) (n - 1)));
            }
        }
    }
    return nodes;
}